

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorRefinementAmenability.cpp
# Opt level: O1

Labeling * __thiscall
ColorRefinementAmenability::ColorRefinementAmenability::compute_stable_coloring
          (Labeling *__return_storage_ptr__,ColorRefinementAmenability *this,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *node_colors,
          unordered_multimap<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
          *colors_to_nodes,
          unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
          *node_to_color)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  Label *c;
  size_t __new_size;
  ulong uVar4;
  pointer puVar5;
  size_t sVar6;
  Labels *__range3;
  int iVar7;
  Node *n;
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var8;
  ulong uVar9;
  Labels colors;
  Label new_color;
  Labels new_coloring;
  Nodes neighbors;
  Labels coloring;
  __hashtable *__h_1;
  __hashtable *__h;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  new_colors;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  int local_ec;
  Labeling *local_e8;
  ulong local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_c0;
  Graph *local_b8;
  Nodes local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_80;
  _Insert_base<unsigned_long,std::pair<unsigned_long_const,unsigned_int>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
  *local_78;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_70;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_e8 = __return_storage_ptr__;
  local_c0 = &node_colors->_M_h;
  local_b8 = &this->m_graph;
  local_80 = (_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)node_to_color;
  local_78 = (_Insert_base<unsigned_long,std::pair<unsigned_long_const,unsigned_int>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              *)colors_to_nodes;
  __new_size = GraphLibrary::Graph::get_num_nodes(&this->m_graph);
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_buckets = (__buckets_ptr)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&local_98,__new_size,(value_type_conflict2 *)&local_68);
  local_68._M_buckets = (__buckets_ptr)0x1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&local_d8,__new_size,(value_type_conflict2 *)&local_68);
  iVar7 = 1;
  do {
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_ec = iVar7;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&local_98,&local_d8);
    if (__new_size != 0) {
      uVar9 = 0;
      do {
        local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (ulong *)0x0;
        local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
        local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
        GraphLibrary::Graph::get_neighbours(&local_b0,local_b8,(Node)uVar9);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  (&local_108,
                   ((long)local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2) + 1);
        puVar3 = local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (p_Var8 = (_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                       *)local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
            puVar2 = local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
            puVar5 = local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start,
            p_Var8 != (_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                       *)puVar3; p_Var8 = p_Var8 + 4) {
          if (local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
                       local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + *(uint *)p_Var8);
          }
          else {
            *local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish =
                 local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[*(uint *)p_Var8];
            local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
        }
        if (local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          uVar4 = (long)local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3;
          lVar1 = 0x3f;
          if (uVar4 != 0) {
            for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar5,puVar2);
        }
        if (local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_108,
                     (iterator)
                     local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar9);
        }
        else {
          *local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish =
               local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9];
          local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_e0 = local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1];
        local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
        for (puVar5 = local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            puVar5 != local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
          uVar4 = *puVar5;
          if (local_e0 < uVar4) {
            local_e0 = local_e0 + uVar4 * uVar4;
          }
          else {
            local_e0 = (local_e0 + 1) * local_e0 + uVar4;
          }
        }
        local_70 = &local_68;
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_70,&local_e0,&local_70);
        local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9] = local_e0;
        if ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             *)local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start !=
            (_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             *)0x0) {
          operator_delete(local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (ulong *)0x0) {
          operator_delete(local_108.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar9 = (ulong)((Node)uVar9 + 1);
      } while (uVar9 < __new_size);
    }
    iVar7 = (int)local_68._M_element_count;
    if (local_ec == (int)local_68._M_element_count) {
      sVar6 = GraphLibrary::Graph::get_num_nodes(local_b8);
      if (&local_68 != local_c0) {
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_c0,&local_68);
      }
      if ((int)sVar6 != 0) {
        uVar9 = 0;
        do {
          local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar9];
          local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(local_108.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._4_4_,(int)uVar9);
          local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_78;
          std::__detail::
          _Insert_base<unsigned_long,std::pair<unsigned_long_const,unsigned_int>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
          ::
          _M_insert_range<std::pair<unsigned_long_const,unsigned_int>const*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_long_const,unsigned_int>,false>>>>
                    (local_78,&local_108,
                     &local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,&local_b0);
          local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_108.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,(int)uVar9);
          local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar9];
          local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_80;
          std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_insert<std::pair<unsigned_int_const,unsigned_long>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,unsigned_long>,false>>>>
                    (local_80,&local_108,&local_b0);
          uVar9 = uVar9 + 1;
        } while ((sVar6 & 0xffffffff) != uVar9);
      }
    }
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68);
  } while (local_ec != iVar7);
  if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return local_e8;
}

Assistant:

Labeling ColorRefinementAmenability::compute_stable_coloring(unordered_set<Label> &node_colors,
                                                                 unordered_multimap<Label, Node> &colors_to_nodes,
                                                                 unordered_map<Node, Label> &node_to_color) const {
        Labeling node_label;
        size_t num_nodes = m_graph.get_num_nodes();

        Labels coloring;
        Labels new_coloring;

        // Labels each node with the same label.
        coloring.resize(num_nodes, 0);
        new_coloring.resize(num_nodes, 1);
        uint num_old_colors = -1;
        uint num_new_colors = 1;

        while (num_new_colors != num_old_colors) {
            unordered_set<Label> new_colors;

            // Update coloring.
            coloring = new_coloring;
            num_old_colors = num_new_colors;

            // Iterate over all nodes.
            for (Node v = 0; v < num_nodes; ++v) {
                Labels colors;
                Nodes neighbors(m_graph.get_neighbours(v));
                colors.reserve(neighbors.size() + 1);

                // Get colors of neighbors.
                for (const Node &n: neighbors) {
                    colors.push_back(coloring[n]);
                }
                sort(colors.begin(), colors.end());
                colors.push_back(coloring[v]);

                // Compute new label using composition to bijectively map two integers to on integer.ŧ
                Label new_color = colors.back();
                colors.pop_back();
                for (const Label &c: colors) {
                    new_color = pairing(new_color, c);
                }

                new_colors.insert(new_color);
                new_coloring[v] = new_color;

            }

            num_new_colors = new_colors.size();
            if (num_new_colors == num_old_colors) {
                uint num_nodes = m_graph.get_num_nodes();

                node_colors = new_colors;

                for (Node i = 0; i < num_nodes; ++i) {
                    colors_to_nodes.insert({{new_coloring[i], i}});
                    node_to_color.insert({{i, new_coloring[i]}});
                }
            }

        }

        return node_label;
    }